

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emap.c
# Opt level: O1

void duckdb_je_emap_remap(tsdn_t *tsdn,emap_t *emap,edata_t *edata,szind_t szind,_Bool slab)

{
  rtree_ctx_cache_elm_t *prVar1;
  ulong *puVar2;
  void *key;
  rtree_leaf_elm_t *prVar3;
  uintptr_t key_00;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  rtree_ctx_cache_elm_t *prVar8;
  rtree_ctx_cache_elm_t *prVar9;
  ulong uVar10;
  ulong uVar11;
  rtree_ctx_t *ctx;
  uint uVar12;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_leaf_elm_t *local_1c0;
  rtree_leaf_elm_t *local_1b8;
  rtree_ctx_t local_1b0;
  
  if (tsdn == (tsdn_t *)0x0) {
    ctx = &local_1b0;
    duckdb_je_rtree_ctx_data_init(ctx);
  }
  else {
    ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  if (szind != 0xe8) {
    uVar5 = edata->e_bits;
    key = edata->e_addr;
    uVar4 = (ulong)key & 0xffffffffc0000000;
    uVar6 = (ulong)(((uint)((ulong)key >> 0x1e) & 0xf) << 4);
    puVar2 = (ulong *)((long)&ctx->cache[0].leafkey + uVar6);
    uVar6 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar6);
    if (uVar6 == uVar4) {
      prVar3 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)key >> 9) & 0x1ffff8) + puVar2[1]);
    }
    else if (ctx->l2_cache[0].leafkey == uVar4) {
      prVar3 = ctx->l2_cache[0].leaf;
      ctx->l2_cache[0].leafkey = uVar6;
      ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar4;
      puVar2[1] = (ulong)prVar3;
      prVar3 = (rtree_leaf_elm_t *)
               ((long)&(prVar3->le_bits).repr + (ulong)((uint)key >> 9 & 0x1ffff8));
    }
    else {
      prVar8 = ctx->l2_cache + 1;
      if (ctx->l2_cache[1].leafkey == uVar4) {
        uVar10 = 0;
        local_1b8 = (rtree_leaf_elm_t *)0x0;
      }
      else {
        prVar9 = prVar8;
        uVar11 = 1;
        do {
          uVar10 = uVar11;
          if (uVar10 == 7) {
            prVar3 = (rtree_leaf_elm_t *)CONCAT71((int7)((ulong)puVar2 >> 8),6 < uVar10);
            local_1b8 = prVar3;
            goto LAB_01c86131;
          }
          prVar8 = prVar9 + 1;
          prVar1 = prVar9 + 1;
          prVar9 = prVar8;
          uVar11 = uVar10 + 1;
        } while (prVar1->leafkey != uVar4);
        local_1b8 = (rtree_leaf_elm_t *)(ulong)(6 < uVar10);
      }
      prVar3 = prVar8->leaf;
      prVar8->leafkey = ctx->l2_cache[uVar10].leafkey;
      prVar8->leaf = ctx->l2_cache[uVar10].leaf;
      ctx->l2_cache[uVar10].leafkey = uVar6;
      ctx->l2_cache[uVar10].leaf = (rtree_leaf_elm_t *)puVar2[1];
      *puVar2 = uVar4;
      puVar2[1] = (ulong)prVar3;
      prVar3 = (rtree_leaf_elm_t *)
               ((long)&(prVar3->le_bits).repr + (ulong)((uint)((ulong)key >> 9) & 0x1ffff8));
LAB_01c86131:
      if ((char)local_1b8 != '\0') {
        prVar3 = duckdb_je_rtree_leaf_elm_lookup_hard
                           (tsdn,&emap->rtree,ctx,(uintptr_t)key,false,true);
      }
    }
    bVar7 = (byte)(uVar5 >> 0x2c) & 1;
    uVar12 = (uint)(uVar5 >> 0x11) & 7;
    if (prVar3 != (rtree_leaf_elm_t *)0x0) {
      (prVar3->le_bits).repr =
           (void *)(((ulong)szind << 0x30) + (ulong)uVar12 * 4 + (ulong)bVar7 * 2 | (ulong)slab |
                   (ulong)edata & 0xffffffffffff);
    }
    if ((slab) && (uVar5 = (edata->field_2).e_size_esn & 0xfffffffffffff000, 0x1000 < uVar5)) {
      key_00 = (((ulong)edata->e_addr & 0xfffffffffffff000) + uVar5) - 0x1000;
      uVar6 = key_00 & 0xffffffffc0000000;
      uVar5 = (ulong)(((uint)(key_00 >> 0x1e) & 0xf) << 4);
      puVar2 = (ulong *)((long)&ctx->cache[0].leafkey + uVar5);
      uVar5 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar5);
      if (uVar5 == uVar6) {
        prVar3 = (rtree_leaf_elm_t *)((ulong)((uint)(key_00 >> 9) & 0x1ffff8) + puVar2[1]);
      }
      else if (ctx->l2_cache[0].leafkey == uVar6) {
        prVar3 = ctx->l2_cache[0].leaf;
        ctx->l2_cache[0].leafkey = uVar5;
        ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
        *puVar2 = uVar6;
        puVar2[1] = (ulong)prVar3;
        prVar3 = (rtree_leaf_elm_t *)
                 ((long)&(prVar3->le_bits).repr + (ulong)((uint)key_00 >> 9 & 0x1ffff8));
      }
      else {
        prVar8 = ctx->l2_cache + 1;
        if (ctx->l2_cache[1].leafkey == uVar6) {
          uVar11 = 0;
          local_1c0 = (rtree_leaf_elm_t *)0x0;
        }
        else {
          uVar4 = 1;
          prVar9 = prVar8;
          do {
            uVar11 = uVar4;
            if (uVar11 == 7) {
              prVar3 = (rtree_leaf_elm_t *)CONCAT71((int7)((ulong)puVar2 >> 8),6 < uVar11);
              local_1c0 = prVar3;
              goto LAB_01c861dd;
            }
            prVar8 = prVar9 + 1;
            prVar1 = prVar9 + 1;
            uVar4 = uVar11 + 1;
            prVar9 = prVar8;
          } while (prVar1->leafkey != uVar6);
          local_1c0 = (rtree_leaf_elm_t *)(ulong)(6 < uVar11);
        }
        prVar3 = prVar8->leaf;
        prVar8->leafkey = ctx->l2_cache[uVar11].leafkey;
        prVar8->leaf = ctx->l2_cache[uVar11].leaf;
        ctx->l2_cache[uVar11].leafkey = uVar5;
        ctx->l2_cache[uVar11].leaf = (rtree_leaf_elm_t *)puVar2[1];
        *puVar2 = uVar6;
        puVar2[1] = (ulong)prVar3;
        prVar3 = (rtree_leaf_elm_t *)
                 ((long)&(prVar3->le_bits).repr + (ulong)((uint)(key_00 >> 9) & 0x1ffff8));
LAB_01c861dd:
        if ((char)local_1c0 != '\0') {
          prVar3 = duckdb_je_rtree_leaf_elm_lookup_hard(tsdn,&emap->rtree,ctx,key_00,false,true);
        }
      }
      if (prVar3 != (rtree_leaf_elm_t *)0x0) {
        (prVar3->le_bits).repr =
             (void *)(((ulong)szind << 0x30) + (ulong)uVar12 * 4 + (ulong)bVar7 * 2 | (ulong)slab |
                     (ulong)edata & 0xffffffffffff);
      }
    }
  }
  return;
}

Assistant:

void
emap_remap(tsdn_t *tsdn, emap_t *emap, edata_t *edata, szind_t szind,
    bool slab) {
	EMAP_DECLARE_RTREE_CTX;

	if (szind != SC_NSIZES) {
		rtree_contents_t contents;
		contents.edata = edata;
		contents.metadata.szind = szind;
		contents.metadata.slab = slab;
		contents.metadata.is_head = edata_is_head_get(edata);
		contents.metadata.state = edata_state_get(edata);

		rtree_write(tsdn, &emap->rtree, rtree_ctx,
		    (uintptr_t)edata_addr_get(edata), contents);
		/*
		 * Recall that this is called only for active->inactive and
		 * inactive->active transitions (since only active extents have
		 * meaningful values for szind and slab).  Active, non-slab
		 * extents only need to handle lookups at their head (on
		 * deallocation), so we don't bother filling in the end
		 * boundary.
		 *
		 * For slab extents, we do the end-mapping change.  This still
		 * leaves the interior unmodified; an emap_register_interior
		 * call is coming in those cases, though.
		 */
		if (slab && edata_size_get(edata) > PAGE) {
			uintptr_t key = (uintptr_t)edata_past_get(edata)
			    - (uintptr_t)PAGE;
			rtree_write(tsdn, &emap->rtree, rtree_ctx, key,
			    contents);
		}
	}
}